

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::read_restart_marker
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
           *this)

{
  uint8_t uVar1;
  byte bVar2;
  
  uVar1 = decoder_strategy::read_byte(&this->super_decoder_strategy);
  if (uVar1 == 0xff) {
    do {
      bVar2 = decoder_strategy::read_byte(&this->super_decoder_strategy);
    } while (bVar2 == 0xff);
    if (this->restart_interval_counter_ + 0xd0 == (uint)bVar2) {
      return;
    }
  }
  impl::throw_jpegls_error(restart_marker_not_found);
}

Assistant:

void read_restart_marker()
    {
        auto byte{Strategy::read_byte()};
        if (UNLIKELY(byte != jpeg_marker_start_byte))
            impl::throw_jpegls_error(jpegls_errc::restart_marker_not_found);

        // Read all preceding 0xFF fill values until a non 0xFF value has been found. (see T.81, B.1.1.2)
        do
        {
            byte = Strategy::read_byte();
        } while (byte == jpeg_marker_start_byte);

        if (UNLIKELY(byte != jpeg_restart_marker_base + restart_interval_counter_))
            impl::throw_jpegls_error(jpegls_errc::restart_marker_not_found);
    }